

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

RegularExpression * TransformCompile(RegularExpression *__return_storage_ptr__,string *str)

{
  cmsys::RegularExpression::RegularExpression(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

static cmsys::RegularExpression TransformCompile(const std::string& str)
{
  return cmsys::RegularExpression(str);
}